

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O3

void __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::CheckFreeBitVector
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,bool isCollecting)

{
  ulong uVar1;
  ulong *puVar2;
  ushort uVar3;
  code *pcVar4;
  anon_class_24_3_3b104623 fn;
  bool bVar5;
  BOOLEAN BVar6;
  BVIndex BVar7;
  uint uVar8;
  uint uVar9;
  SmallHeapBlockBitVector *pSVar10;
  undefined4 *puVar11;
  FreeObject *this_00;
  ulong uVar12;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *this_01;
  long lVar13;
  undefined7 in_register_00000031;
  BVIndex BVar14;
  Type TStack_88;
  SmallHeapBlockBitVector temp;
  SmallHeapBlockBitVector *local_50;
  SmallHeapBlockBitVector *free;
  SmallHeapBlockBitVector *local_40;
  uint local_34 [2];
  uint verifyFreeCount;
  
  if (((int)CONCAT71(in_register_00000031,isCollecting) == 0) &&
     ((*(this->super_HeapBlock)._vptr_HeapBlock[0x10])(this),
     (FreeObject *)TStack_88.word != this->freeObjectList)) {
    CheckDebugFreeBitVector(this,false);
    return;
  }
  local_50 = &this->freeBits;
  temp.data[1].word = 0;
  temp.data[2].word = 0;
  TStack_88.word = 0;
  temp.data[0].word = 0;
  local_40 = local_50;
  js_memcpy_s(&TStack_88,0x20,local_50,0x20);
  pSVar10 = GetInvalidBitVector(this);
  lVar13 = 0;
  do {
    puVar2 = (ulong *)((long)(temp.data + -1) + lVar13);
    *puVar2 = *puVar2 & *(ulong *)((long)&pSVar10->data[0].word + lVar13);
    lVar13 = lVar13 + 8;
  } while (lVar13 != 0x20);
  if (TStack_88.word == 0) {
    uVar12 = 0xffffffffffffffff;
    do {
      if (uVar12 == 2) goto LAB_006a6e22;
      uVar1 = uVar12 + 1;
      lVar13 = uVar12 + 1;
      uVar12 = uVar1;
    } while (temp.data[lVar13].word == 0);
    if (uVar1 < 3) goto LAB_006a6dce;
  }
  else {
LAB_006a6dce:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x71d,"(temp.IsAllClear())","temp.IsAllClear()");
    if (!bVar5) goto LAB_006a7251;
    *puVar11 = 0;
  }
LAB_006a6e22:
  local_34[0] = 0;
  this_00 = this->freeObjectList;
  if (this_00 == (FreeObject *)0x0) {
    BVar14 = 0;
  }
  else {
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    free = &this->debugFreeBits;
    BVar14 = 0;
    do {
      if (((ulong)this_00 & 0xf) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                           ,0x24d,"(HeapInfo::IsAlignedAddress(objectAddress))",
                           "HeapInfo::IsAlignedAddress(objectAddress)");
        if (!bVar5) goto LAB_006a7251;
        *puVar11 = 0;
      }
      uVar8 = (uint)((ulong)this_00 >> 4) & 0xff;
      bVar5 = IsValidBitIndex(this,uVar8);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x724,"(IsValidBitIndex(bitIndex))","IsValidBitIndex(bitIndex)");
        if (!bVar5) goto LAB_006a7251;
        *puVar11 = 0;
      }
      BVar6 = BVStatic<256UL>::Test(free,uVar8);
      if (BVar6 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x725,"(this->GetDebugFreeBitVector()->Test(bitIndex))",
                           "this->GetDebugFreeBitVector()->Test(bitIndex)");
        if (!bVar5) goto LAB_006a7251;
        *puVar11 = 0;
      }
      BVar6 = BVStatic<256UL>::Test(local_40,uVar8);
      if (BVar6 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x726,"(free->Test(bitIndex))","free->Test(bitIndex)");
        if (!bVar5) goto LAB_006a7251;
        *puVar11 = 0;
      }
      BVar14 = BVar14 + 1;
      local_34[0] = BVar14;
      this_00 = FreeObject::GetNext(this_00);
    } while (this_00 != (FreeObject *)0x0);
  }
  BVar7 = BVStatic<256UL>::Count(&this->debugFreeBits);
  if (BVar7 != BVar14) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x72b,"(this->GetDebugFreeBitVector()->Count() == verifyFreeCount)",
                       "this->GetDebugFreeBitVector()->Count() == verifyFreeCount");
    if (!bVar5) goto LAB_006a7251;
    *puVar11 = 0;
  }
  uVar3 = this->freeCount;
  BVar7 = BVStatic<256UL>::Count(local_40);
  if (BVar7 != uVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x72c,"(this->freeCount == this->GetFreeBitVector()->Count())",
                       "this->freeCount == this->GetFreeBitVector()->Count()");
    if (!bVar5) goto LAB_006a7251;
    *puVar11 = 0;
  }
  uVar8 = (uint)(this->super_HeapBlock).heapBlockType;
  if ((uVar8 < 0xb) && ((0x528U >> (uVar8 & 0x1f) & 1) != 0)) {
    this_01 = HeapBlock::AsFinalizableBlock<SmallAllocationBlockAttributes>(&this->super_HeapBlock);
    fn.free = &local_50;
    fn.this = this;
    fn.verifyFreeCount = local_34;
    temp.data[3].word = (Type)this;
    SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::
    ForEachPendingDisposeObject<Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::CheckFreeBitVector(bool)::_lambda(unsigned_int)_1_>
              (this_01,fn);
    uVar9 = SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::
            CheckDisposedObjectFreeBitVector(this_01);
    BVar14 = uVar9 + local_34[0];
    local_34[0] = BVar14;
  }
  if (BVar14 != this->freeCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x73f,"(verifyFreeCount == this->freeCount)",
                       "verifyFreeCount == this->freeCount");
    if (!bVar5) goto LAB_006a7251;
    *puVar11 = 0;
    BVar14 = local_34[0];
  }
  if (this->lastFreeCount < BVar14) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x740,"(verifyFreeCount <= this->lastFreeCount)",
                       "verifyFreeCount <= this->lastFreeCount");
    if (!bVar5) goto LAB_006a7251;
    *puVar11 = 0;
  }
  if (this->freeObjectList != this->lastFreeObjectHead) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x741,"(this->IsFreeBitsValid())","this->IsFreeBitsValid()");
    if (!bVar5) {
LAB_006a7251:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar11 = 0;
  }
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::CheckFreeBitVector(bool isCollecting)
{
    // during collection, the heap block has the current info when we are verifying
    if (!isCollecting)
    {
        FreeObject * freeObjectList;
        this->GetFreeObjectListOnAllocator(&freeObjectList);
        if (freeObjectList != this->freeObjectList)
        {
            // allocator has the current info and if we have already allocated some memory,
            // the free bit vector isn't really correct, so we can't verify it.
            // Just verify the debug free bit vector
            this->CheckDebugFreeBitVector(false);
            return;
        }
    }

    SmallHeapBlockBitVector * free = this->GetFreeBitVector();

    // Shouldn't be any invalid bits set in the free bit vector
    SmallHeapBlockBitVector temp;
    temp.Copy(free);
    temp.And(this->GetInvalidBitVector());
    Assert(temp.IsAllClear());

    uint verifyFreeCount = 0;
    FreeObject * freeObject = this->freeObjectList;
    while (freeObject != nullptr)
    {
        uint bitIndex = GetAddressBitIndex(freeObject);
        Assert(IsValidBitIndex(bitIndex));
        Assert(this->GetDebugFreeBitVector()->Test(bitIndex));
        Assert(free->Test(bitIndex));
        verifyFreeCount++;

        freeObject = freeObject->GetNext();
    }
    Assert(this->GetDebugFreeBitVector()->Count() == verifyFreeCount);
    Assert(this->freeCount == this->GetFreeBitVector()->Count());

    if (this->IsAnyFinalizableBlock())
    {
        auto finalizableBlock = this->AsFinalizableBlock<TBlockAttributes>();

        // Include pending dispose objects
        finalizableBlock->ForEachPendingDisposeObject([&] (uint index) {
            uint bitIndex = ((uint)index) * this->GetObjectBitDelta();
            Assert(IsValidBitIndex(bitIndex));
            Assert(!this->GetDebugFreeBitVector()->Test(bitIndex));
            Assert(free->Test(bitIndex));
            verifyFreeCount++;
        });

        // Include disposed objects
        verifyFreeCount += finalizableBlock->CheckDisposedObjectFreeBitVector();
    }

    Assert(verifyFreeCount == this->freeCount);
    Assert(verifyFreeCount <= this->lastFreeCount);
    Assert(this->IsFreeBitsValid());
}